

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

Element __thiscall wasm::RandomLattice::makeElement(RandomLattice *this)

{
  SharedPath<wasm::RandomLattice> *this_00;
  bool bVar1;
  uint32_t uVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  _Head_base<0UL,_void_*,_false> _Var3;
  undefined8 *in_RSI;
  RandomLattice *this_01;
  size_t i;
  _Head_base<1UL,_void_(*)(void_*),_false> _Var4;
  type *l;
  Element EVar5;
  RandomLattice local_a8;
  RandomLattice local_98;
  _Variadic_union<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  local_88;
  undefined1 local_68;
  undefined1 auStack_58 [8];
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  elem;
  
  this_00 = (SharedPath<wasm::RandomLattice> *)in_RSI[1];
  if (this_00 == (SharedPath<wasm::RandomLattice> *)0x0) {
switchD_001a42d8_default:
    wasm::handle_unreachable
              ("unexpected lattice",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,0x17f);
  }
  switch(*(undefined1 *)&this_00[1].lattice.rand) {
  case 0:
    RandomFullLattice::makeElement((RandomFullLattice *)auStack_58);
    local_88._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_58;
    local_88._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68 = 0;
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_88._M_first);
    this_01 = (RandomLattice *)auStack_58;
    goto LAB_001a4570;
  case 1:
    uVar2 = Random::upTo((Random *)*in_RSI,6);
    if (uVar2 == 5) {
      local_88._M_rest._0_8_ = (undefined8)(Element)0x200000000;
      local_68 = 1;
      RandomElement<wasm::RandomLattice>::RandomElement
                ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    }
    else if (uVar2 == 4) {
      local_88._M_rest._0_8_ = (undefined8)(Element)0x0;
      local_68 = 1;
      RandomElement<wasm::RandomLattice>::RandomElement
                ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    }
    else {
      local_88._M_rest._0_8_ = (undefined8)((ulong)uVar2 | 0x100000000);
      local_68 = 1;
      RandomElement<wasm::RandomLattice>::RandomElement
                ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    }
    break;
  case 2:
    bVar1 = Random::oneIn((Random *)*in_RSI,4);
    if (!bVar1) {
      makeElement(&local_98);
      auStack_58 = (undefined1  [8])local_98.rand;
      elem.
      super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_98.lattice._M_t.
                    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
      local_98.lattice._M_t.
      super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
            )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
              )0x0;
    }
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(elem.
                           super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,!bVar1);
    std::
    variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::
    variant<wasm::analysis::Lift<wasm::RandomLattice>::Element,void,void,wasm::analysis::Lift<wasm::RandomLattice>::Element,void>
              ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                *)&local_88._M_first,(Element *)auStack_58);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_88._M_first);
    std::_Optional_payload_base<wasm::RandomElement<wasm::RandomLattice>_>::_M_reset
              ((_Optional_payload_base<wasm::RandomElement<wasm::RandomLattice>_> *)auStack_58);
    _Var3._M_head_impl = extraout_RDX_01;
    if (bVar1) goto LAB_001a45b9;
    goto LAB_001a4569;
  case 3:
    makeElement((RandomLattice *)auStack_58);
    makeElement((RandomLattice *)
                &elem.
                 super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::
    variant<std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,void,void,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,void>
              ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                *)&local_88._M_first,
               (array<wasm::RandomElement<wasm::RandomLattice>,_2UL> *)auStack_58);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_88._M_first);
    std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>::~array
              ((array<wasm::RandomElement<wasm::RandomLattice>,_2UL> *)auStack_58);
    _Var3._M_head_impl = extraout_RDX;
    goto LAB_001a45b9;
  case 4:
    auStack_58 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::reserve((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_58,
              (size_type)
              (this_00->val).super_unique_ptr<void,_void_(*)(void_*)>._M_t.
              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>);
    for (_Var4._M_head_impl = (_func_void_void_ptr *)0x0;
        _Var4._M_head_impl <
        (_func_void_void_ptr *)
        (this_00->val).super_unique_ptr<void,_void_(*)(void_*)>._M_t.
        super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
        super__Head_base<1UL,_void_(*)(void_*),_false>; _Var4._M_head_impl = _Var4._M_head_impl + 1)
    {
      makeElement((RandomLattice *)&local_88._M_first);
      std::
      vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
      ::emplace_back<wasm::RandomElement<wasm::RandomLattice>>
                ((vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
                  *)auStack_58,(RandomElement<wasm::RandomLattice> *)&local_88._M_first);
      std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<void,_void_(*)(void_*)> *)&local_88._M_first);
    }
    local_88._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_58;
    local_88._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_58 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68 = 4;
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_88._M_first);
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::~vector((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_58);
    _Var3._M_head_impl = extraout_RDX_00;
    goto LAB_001a45b9;
  case 5:
    makeElement(&local_98);
    makeElement(&local_a8);
    std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
    ::
    tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>,_true>
              ((tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
                *)auStack_58,(RandomElement<wasm::RandomLattice> *)&local_98,
               (RandomElement<wasm::RandomLattice> *)&local_a8);
    std::
    variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::
    variant<std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,void,void,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,void>
              ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                *)&local_88._M_first,
               (tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
                *)auStack_58);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_88._M_first);
    std::
    _Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
                    *)auStack_58);
    std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<void,_void_(*)(void_*)> *)&local_a8);
LAB_001a4569:
    this_01 = &local_98;
LAB_001a4570:
    std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<void,_void_(*)(void_*)> *)this_01);
    _Var3._M_head_impl = extraout_RDX_02;
    goto LAB_001a45b9;
  case 6:
    auStack_58 = (undefined1  [8])&this_00->val;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)elem.
                          super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    makeElement((RandomLattice *)&local_88._M_first);
    analysis::SharedPath<wasm::RandomLattice>::join<wasm::RandomElement<wasm::RandomLattice>>
              (this_00,(Element *)auStack_58,
               (RandomElement<wasm::RandomLattice> *)&local_88._M_first);
    std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<void,_void_(*)(void_*)> *)&local_88._M_first);
    local_88._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_58;
    local_88._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68 = 6;
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_88._M_first);
    break;
  default:
    goto switchD_001a42d8_default;
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_88._M_first);
  _Var3._M_head_impl = extraout_RDX_03;
LAB_001a45b9:
  EVar5.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  EVar5.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar5.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomLattice::Element RandomLattice::makeElement() const noexcept {
  if (const auto* l = std::get_if<RandomFullLattice>(lattice.get())) {
    return ElementImpl{l->makeElement()};
  }
  if (const auto* l = std::get_if<Flat<uint32_t>>(lattice.get())) {
    auto pick = rand.upTo(6);
    switch (pick) {
      case 4:
        return ElementImpl{l->getBottom()};
      case 5:
        return ElementImpl{l->getTop()};
      default:
        return ElementImpl{l->get(std::move(pick))};
    }
  }
  if (const auto* l = std::get_if<Lift<RandomLattice>>(lattice.get())) {
    return ElementImpl{rand.oneIn(4) ? l->getBottom()
                                     : l->get(l->lattice.makeElement())};
  }
  if (const auto* l = std::get_if<ArrayLattice>(lattice.get())) {
    return ElementImpl{typename ArrayLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomLattice>>(lattice.get())) {
    std::vector<typename RandomLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleLattice>(lattice.get())) {
    return ElementImpl{
      typename TupleLattice::Element{std::get<0>(l->lattices).makeElement(),
                                     std::get<1>(l->lattices).makeElement()}};
  }
  if (const auto* l = std::get_if<SharedPath<RandomLattice>>(lattice.get())) {
    auto elem = l->getBottom();
    l->join(elem, l->lattice.makeElement());
    return ElementImpl{elem};
  }
  WASM_UNREACHABLE("unexpected lattice");
}